

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O1

_Bool store_get_check(char *prompt)

{
  void *pvVar1;
  _Bool _Var2;
  keypress kVar3;
  
  _Var2 = false;
  prt(prompt,L'\0',L'\0');
  kVar3 = inkey();
  prt("",L'\0',L'\0');
  if (kVar3._0_8_ >> 0x20 != 0xe000) {
    pvVar1 = memchr("Nn",kVar3.code,3);
    _Var2 = pvVar1 == (void *)0x0;
  }
  return _Var2;
}

Assistant:

static bool store_get_check(const char *prompt)
{
	struct keypress ch;

	/* Prompt for it */
	prt(prompt, 0, 0);

	/* Get an answer */
	ch = inkey();

	/* Erase the prompt */
	prt("", 0, 0);

	if (ch.code == ESCAPE) return (false);
	if (strchr("Nn", ch.code)) return (false);

	/* Success */
	return (true);
}